

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microui.c
# Opt level: O2

void mu_draw_rect(mu_Context *ctx,mu_Rect rect,mu_Color color)

{
  mu_Command *pmVar1;
  mu_Rect mVar2;
  
  mVar2 = mu_get_clip_rect(ctx);
  mVar2 = intersect_rects(rect,mVar2);
  if (0 < mVar2.h && 0 < mVar2.w) {
    pmVar1 = mu_push_command(ctx,3,0x1c);
    (pmVar1->clip).rect = mVar2;
    (pmVar1->rect).color = color;
  }
  return;
}

Assistant:

void mu_draw_rect(mu_Context *ctx, mu_Rect rect, mu_Color color) {
  mu_Command *cmd;
  rect = intersect_rects(rect, mu_get_clip_rect(ctx));
  if (rect.w > 0 && rect.h > 0) {
    cmd = mu_push_command(ctx, MU_COMMAND_RECT, sizeof(mu_RectCommand));
    cmd->rect.rect = rect;
    cmd->rect.color = color;
  }
}